

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

void restore_branch(memfile *mf,branch *b)

{
  int8_t iVar1;
  int32_t iVar2;
  branch *b_local;
  memfile *mf_local;
  
  b->next = (branch *)0x0;
  iVar2 = mread32(mf);
  b->id = iVar2;
  iVar2 = mread32(mf);
  b->type = iVar2;
  mread(mf,&b->end1,2);
  mread(mf,&b->end2,2);
  iVar1 = mread8(mf);
  b->end1_up = iVar1;
  return;
}

Assistant:

static void restore_branch(struct memfile *mf, branch *b)
{
    b->next = NULL;
    b->id = mread32(mf);
    b->type = mread32(mf);
    mread(mf, &b->end1, sizeof(d_level));
    mread(mf, &b->end2, sizeof(d_level));
    b->end1_up = mread8(mf);
}